

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

void __thiscall CCNR::ls_solver::simple_print(ls_solver *this)

{
  ostream *poVar1;
  char local_12;
  char local_11;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_12,1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  poVar1 = std::ostream::_M_insert<double>(this->_best_cost_time);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void ls_solver::simple_print() { cout << '\t' << _best_found_cost << '\t' << _best_cost_time << endl; }